

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O1

bool __thiscall
Sudoku::columnCheck(Sudoku *this,
                   list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *furtherWays_,
                   vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                   *testFields,bool recordFullFurtherWays,bool debug)

{
  int *piVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  uint uVar8;
  int i;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint local_78;
  Way local_50;
  list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *local_38;
  
  uVar8 = 0;
  if (this->squared_size_ < 1) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    local_38 = furtherWays_;
    do {
      if (0 < this->squared_size_) {
        i = 1;
        do {
          if (this->squared_size_ < 1) {
            bVar3 = true;
            uVar10 = 0;
          }
          else {
            uVar10 = 0;
            local_78 = 0;
            uVar9 = 0;
            do {
              iVar5 = (*this->_vptr_Sudoku[7])(this,(ulong)uVar8,uVar10);
              iVar5 = Field::value((testFields->
                                   super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[iVar5].
                                   super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
              if (iVar5 == i) break;
              iVar6 = (*this->_vptr_Sudoku[7])(this,(ulong)uVar8,uVar10);
              bVar3 = Field::valuePossible
                                ((testFields->
                                 super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[iVar6].
                                 super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,i);
              uVar9 = uVar9 + bVar3;
              if (bVar3) {
                local_78 = (uint)uVar10;
              }
              if (1 < uVar9) {
                uVar9 = 2;
                break;
              }
              uVar11 = (uint)uVar10 + 1;
              uVar10 = (ulong)uVar11;
            } while ((int)uVar11 < this->squared_size_);
            bVar3 = uVar9 != 1 || iVar5 == i;
            uVar10 = (ulong)local_78;
          }
          if (bVar3) {
LAB_0010d7fa:
            bVar3 = false;
          }
          else {
            if (debug) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Column check (column ",0x15);
              poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"): value ",9);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,i);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7," has to be in field (",0x15);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->current_z_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
            }
            p_Var2 = (local_38->
                     super__List_base<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_>).
                     _M_impl._M_node.super__List_node_base._M_prev;
            piVar1 = (int *)((long)&p_Var2[1]._M_next + 4);
            *piVar1 = *piVar1 + 1;
            local_50.index = (*this->_vptr_Sudoku[7])(this,(ulong)uVar8,uVar10);
            local_50.posZ = this->current_z_;
            local_50.reason = onlyPositionInColumn;
            local_50.posX = uVar8;
            local_50.posY = (int)uVar10;
            local_50.value = i;
            std::
            _Rb_tree<Sudoku::FurtherWays::Way,Sudoku::FurtherWays::Way,std::_Identity<Sudoku::FurtherWays::Way>,std::less<Sudoku::FurtherWays::Way>,std::allocator<Sudoku::FurtherWays::Way>>
            ::_M_insert_unique<Sudoku::FurtherWays::Way_const&>
                      ((_Rb_tree<Sudoku::FurtherWays::Way,Sudoku::FurtherWays::Way,std::_Identity<Sudoku::FurtherWays::Way>,std::less<Sudoku::FurtherWays::Way>,std::allocator<Sudoku::FurtherWays::Way>>
                        *)&p_Var2[2]._M_prev,&local_50);
            if (recordFullFurtherWays) goto LAB_0010d7fa;
            iVar5 = (*this->_vptr_Sudoku[7])(this,(ulong)uVar8,uVar10);
            Field::setValue((testFields->
                            super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[iVar5].
                            super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,i);
            bVar4 = true;
            bVar3 = true;
          }
        } while ((!bVar3) && (bVar3 = i < this->squared_size_, i = i + 1, bVar3));
      }
    } while ((!bVar4) && (uVar8 = uVar8 + 1, (int)uVar8 < this->squared_size_));
  }
  return bVar4;
}

Assistant:

bool Sudoku::columnCheck(std::list<FurtherWays> &furtherWays_, std::vector<std::shared_ptr<Field>> &testFields, bool recordFullFurtherWays, bool debug)
{
  bool restart = false;

  //check columns, if there are values that can only be at one position
  restart = false;
  for (int x = 0; x < squared_size_; x++)
  {

    for (int value = 1; value <= squared_size_; value++)
    {
      bool valueIsAlreadySet = false;
      int nPossiblePositionsForValue = 0;
      int positionY = 0;
      for (int y = 0; y < squared_size_; y++)
      {
        if(testFields[index(x,y)]->value() == value)
        {
          valueIsAlreadySet = true;
          break;
        }

        if(testFields[index(x,y)]->valuePossible(value))
        {
          nPossiblePositionsForValue++;
          positionY = y;
        }
        if(nPossiblePositionsForValue > 1)
          break;
      }

      //if Value can only be at one position, set it there
      if(nPossiblePositionsForValue == 1 && !valueIsAlreadySet)
      {
        if(debug)
          std::cout<<"Column check (column "<<x<<"): value "<<value<<" has to be in field ("<<x<<","<<positionY<<","<<current_z_<<")"<<std::endl;

        furtherWays_.back().nColumnCheckMatches++;
        furtherWays_.back().addWay(index(x,positionY), x, positionY, current_z_, value, FurtherWays::Reason::onlyPositionInColumn);

        if(!recordFullFurtherWays)
        {
          testFields[index(x,positionY)]->setValue(value);
          restart = true;
          break;
        }
      }
    }
    if(restart)
      break;
  }

  return restart;
}